

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

int32 rw::getSizeHAnim(void *object,int32 offset,int32 param_3)

{
  int *piVar1;
  HAnimData *hanim;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  piVar1 = (int *)((long)object + (long)offset);
  if ((hAnimDoStream == 0) ||
     (((0x34fff < version && (*piVar1 == -1)) && (*(long *)(piVar1 + 2) == 0)))) {
    object_local._4_4_ = 0;
  }
  else if (*(long *)(piVar1 + 2) == 0) {
    object_local._4_4_ = 0xc;
  }
  else {
    object_local._4_4_ = *(int *)(*(long *)(piVar1 + 2) + 4) * 0xc + 0x14;
  }
  return object_local._4_4_;
}

Assistant:

static int32
getSizeHAnim(void *object, int32 offset, int32)
{
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	if(!hAnimDoStream ||
	   (version >= 0x35000 && hanim->id == -1 && hanim->hierarchy == nil))
		return 0;
	if(hanim->hierarchy)
		return 12 + 8 + hanim->hierarchy->numNodes*12;
	return 12;
}